

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mathCoreCompare.cpp
# Opt level: O3

bool mathCore::is_sum(expression *a)

{
  bool bVar1;
  _Rb_tree_node_base *p_Var2;
  
  bVar1 = true;
  if ((a->FLAGS & 3U) == 0) {
    if ((a->FLAGS & 0x20U) == 0) {
      bVar1 = false;
    }
    else {
      p_Var2 = (a->contents)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      while (((_Rb_tree_header *)p_Var2 != &(a->contents)._M_t._M_impl.super__Rb_tree_header &&
             (bVar1 = is_sum(*(expression **)(p_Var2 + 1)), bVar1))) {
        p_Var2 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var2);
      }
    }
  }
  return bVar1;
}

Assistant:

bool mathCore::is_var(expression* a) {
	return a->FLAGS & F_VAR;
}